

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::CharSet<char16_t>::IsSubsetOf(CharSet<char16_t> *this,CharSet<char16_t> *other)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  undefined4 *puVar11;
  ulong uVar12;
  CharSetNode *pCVar13;
  uint index;
  undefined1 auVar14 [16];
  
  pCVar13 = (this->rep).full.root;
  if ((undefined1 *)((long)&pCVar13[-1]._vptr_CharSetNode + 7U) < (undefined1 *)0x5) {
    index = 0;
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    while( true ) {
      if ((undefined1 *)0x4 < (undefined1 *)((long)&pCVar13[-1]._vptr_CharSetNode + 7U)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x1ef,"(IsCompact())","IsCompact()");
        if (!bVar6) {
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar11 = 0;
        pCVar13 = (CharSetNode *)(this->rep).compact.countPlusOne;
      }
      bVar6 = (int)pCVar13 - 1U <= index;
      if (bVar6) break;
      uVar8 = GetCompactCharU(this,index);
      sVar4 = (other->rep).compact.countPlusOne;
      if (sVar4 - 1 < 5) {
        uVar9 = uVar8 & 0xffff;
        auVar14._0_4_ = -(uint)(uVar9 == (other->rep).compact.cs[0]);
        auVar14._4_4_ = -(uint)(uVar9 == (other->rep).compact.cs[1]);
        auVar14._8_4_ = -(uint)(uVar9 == (other->rep).compact.cs[2]);
        auVar14._12_4_ = -(uint)(uVar9 == (other->rep).compact.cs[3]);
        uVar9 = movmskps(uVar9,auVar14);
joined_r0x00e5ca54:
        if (uVar9 == 0) {
          return bVar6;
        }
      }
      else {
        if ((uVar8 & 0xff00) == 0) {
          uVar9 = *(uint *)((long)&other->rep + (ulong)((uVar8 & 0xffff) >> 5) * 4 + 8) >>
                  (uVar8 & 0x1f) & 1;
          goto joined_r0x00e5ca54;
        }
        if (sVar4 == 0) {
          return bVar6;
        }
        bVar7 = Get_helper(other,uVar8 & 0xffff);
        if (!bVar7) {
          return bVar6;
        }
      }
      index = index + 1;
      pCVar13 = (CharSetNode *)(this->rep).compact.countPlusOne;
    }
  }
  else {
    sVar4 = (other->rep).compact.countPlusOne;
    if ((4 < sVar4 - 1) && (((this->rep).compact.cs[0] & ~(other->rep).compact.cs[0]) == 0)) {
      uVar12 = 0xffffffffffffffff;
      do {
        if (uVar12 == 6) goto LAB_00e5caa0;
        lVar2 = uVar12 * 4;
        uVar1 = uVar12 + 1;
        lVar3 = uVar12 * 4;
        uVar12 = uVar1;
      } while ((*(uint *)((long)&this->rep + lVar3 + 0x10) &
               ~*(uint *)((long)&other->rep + lVar2 + 0x10)) == 0);
      if (6 < uVar1) {
LAB_00e5caa0:
        if (pCVar13 == (CharSetNode *)0x0) {
          return true;
        }
        if (sVar4 != 0) {
          iVar10 = (*pCVar13->_vptr_CharSetNode[9])(pCVar13,2);
          return SUB41(iVar10,0);
        }
      }
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool CharSet<char16>::IsSubsetOf(const CharSet<Char>& other) const
    {
        if (IsCompact())
        {
            for (uint i = 0; i < this->GetCompactLength(); i++)
            {
                if (!other.Get(this->GetCompactChar(i)))
                    return false;
            }
            return true;
        }
        else
        {
            if (other.IsCompact())
                return false;
            if (!rep.full.direct.IsSubsetOf(other.rep.full.direct))
                return false;
            if (rep.full.root == nullptr)
                return true;
            if (other.rep.full.root == nullptr)
                return false;
            return rep.full.root->IsSubsetOf(CharSetNode::levels - 1, other.rep.full.root);
        }
    }